

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogreadertest.hpp
# Opt level: O3

void __thiscall
CatalogReaderTest_testConstructorCourseHeirarchyCHE_Test::TestBody
          (CatalogReaderTest_testConstructorCourseHeirarchyCHE_Test *this)

{
  bool bVar1;
  AbstractMajor *major;
  CatalogReader reader;
  CatalogReader local_e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_50;
  
  major = (AbstractMajor *)operator_new(0x40);
  ChemicalEngineering::ChemicalEngineering((ChemicalEngineering *)major);
  CatalogReader::CatalogReader(&local_e0,major);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    CatalogReader::createCourseHeirarchy_abi_cxx11_
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
                *)&local_50,&local_e0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.endDebugString._M_dataplus._M_p != &local_e0.endDebugString.field_2) {
    operator_delete(local_e0.endDebugString._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.beginDebugString._M_dataplus._M_p != &local_e0.beginDebugString.field_2) {
    operator_delete(local_e0.beginDebugString._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.resourceExtension._M_dataplus._M_p != &local_e0.resourceExtension.field_2) {
    operator_delete(local_e0.resourceExtension._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.resourcesPath._M_dataplus._M_p != &local_e0.resourcesPath.field_2) {
    operator_delete(local_e0.resourcesPath._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(CatalogReaderTest, testConstructorCourseHeirarchyCHE) {
    AbstractMajor* major = new ChemicalEngineering();

    CatalogReader reader(major);

    ASSERT_NO_THROW(reader.createCourseHeirarchy());
}